

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O3

void __thiscall kj::_::PromiseNode::OnReadyEvent::armBreadthFirst(OnReadyEvent *this)

{
  Event *this_00;
  Fault f;
  DebugComparison<kj::_::Event_*&,_kj::_::Event_*> _kjCondition;
  
  this_00 = this->event;
  _kjCondition.right = (Event *)0x1;
  _kjCondition.op.content.ptr = " != ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = this_00 != (Event *)0x1;
  _kjCondition.left = &this->event;
  if (_kjCondition.result) {
    if (this_00 != (Event *)0x0) {
      Event::armBreadthFirst(this_00);
    }
    this->event = (Event *)0x1;
    return;
  }
  Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::Event*&,kj::_::Event*>&,char_const(&)[45]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x95e,FAILED,"event != _kJ_ALREADY_READY",
             "_kjCondition,\"armBreadthFirst() should only be called once\"",&_kjCondition,
             (char (*) [45])"armBreadthFirst() should only be called once");
  Debug::Fault::fatal(&f);
}

Assistant:

void PromiseNode::OnReadyEvent::armBreadthFirst() {
  KJ_ASSERT(event != _kJ_ALREADY_READY, "armBreadthFirst() should only be called once");

  if (event != nullptr) {
    // A promise resolved and an event is already waiting on it.
    event->armBreadthFirst();
  }

  event = _kJ_ALREADY_READY;
}